

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O3

void __thiscall
duckdb::UnaryAggregateHeap<float,_duckdb::GreaterThan>::Insert
          (UnaryAggregateHeap<float,_duckdb::GreaterThan> *this,ArenaAllocator *allocator,
          float *value)

{
  float fVar1;
  bool bVar2;
  idx_t iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  HeapEntry<float> *pHVar7;
  long lVar8;
  float local_4c;
  float local_48;
  HeapEntry<float> local_44;
  ulong local_40;
  float *local_38;
  
  pHVar7 = this->heap;
  uVar4 = this->size;
  if (uVar4 < this->capacity) {
    this->size = uVar4 + 1;
    local_4c = *value;
    pHVar7[uVar4].value = local_4c;
    if (1 < (long)(uVar4 + 1)) {
      do {
        uVar6 = uVar4 - 1;
        uVar5 = uVar6 >> 1;
        bVar2 = GreaterThan::Operation<float>(&pHVar7[uVar5].value,&local_4c);
        if (!bVar2) goto LAB_00ed7db5;
        pHVar7[uVar4].value = pHVar7[uVar5].value;
        uVar4 = uVar5;
      } while (1 < uVar6);
      uVar4 = 0;
    }
LAB_00ed7db5:
    pHVar7[uVar4].value = local_4c;
  }
  else {
    bVar2 = GreaterThan::Operation<float>(value,&pHVar7->value);
    if (bVar2) {
      pHVar7 = this->heap;
      iVar3 = this->size;
      if (1 < (long)iVar3) {
        fVar1 = pHVar7[iVar3 - 1].value;
        pHVar7[iVar3 - 1].value = pHVar7->value;
        local_40 = iVar3 * 4 - 4;
        lVar8 = (long)local_40 >> 2;
        local_38 = value;
        if (lVar8 < 3) {
          uVar4 = 0;
        }
        else {
          uVar6 = 0;
          do {
            bVar2 = GreaterThan::Operation<float>
                              (&pHVar7[uVar6 * 2 + 2].value,&pHVar7[uVar6 * 2 + 1].value);
            if (bVar2) {
              uVar4 = uVar6 * 2 + 1;
            }
            else {
              uVar4 = uVar6 * 2 + 2;
            }
            pHVar7[uVar6].value = pHVar7[uVar4].value;
            uVar6 = uVar4;
          } while ((long)uVar4 < (lVar8 - (lVar8 + -1 >> 0x3f)) + -1 >> 1);
        }
        if (((local_40 & 4) == 0) && (uVar4 == lVar8 + -2 >> 1)) {
          pHVar7[uVar4].value = pHVar7[uVar4 * 2 + 1].value;
          uVar4 = uVar4 * 2 + 1;
        }
        local_44.value = fVar1;
        if (0 < (long)uVar4) {
          do {
            uVar6 = uVar4 - 1;
            uVar5 = uVar6 >> 1;
            bVar2 = GreaterThan::Operation<float>(&pHVar7[uVar5].value,&local_44.value);
            if (!bVar2) goto LAB_00ed7e46;
            pHVar7[uVar4].value = pHVar7[uVar5].value;
            uVar4 = uVar5;
          } while (1 < uVar6);
          uVar4 = 0;
        }
LAB_00ed7e46:
        pHVar7[uVar4].value = local_44.value;
        pHVar7 = this->heap;
        iVar3 = this->size;
        value = local_38;
      }
      local_48 = *value;
      pHVar7[iVar3 - 1].value = local_48;
      lVar8 = (long)(iVar3 << 2) >> 2;
      uVar4 = lVar8 - 1;
      if (1 < lVar8) {
        do {
          uVar6 = uVar4 - 1;
          uVar5 = uVar6 >> 1;
          bVar2 = GreaterThan::Operation<float>(&pHVar7[uVar5].value,&local_48);
          if (!bVar2) goto LAB_00ed7ec2;
          pHVar7[uVar4].value = pHVar7[uVar5].value;
          uVar4 = uVar5;
        } while (1 < uVar6);
        uVar4 = 0;
      }
LAB_00ed7ec2:
      pHVar7[uVar4].value = local_48;
    }
  }
  return;
}

Assistant:

void Insert(ArenaAllocator &allocator, const T &value) {
		D_ASSERT(capacity != 0); // must be initialized

		// If the heap is not full, insert the value into a new slot
		if (size < capacity) {
			heap[size++].Assign(allocator, value);
			std::push_heap(heap, heap + size, Compare);
		}
		// If the heap is full, check if the value is greater than the smallest value in the heap
		// If it is, assign the new value to the slot and re-heapify
		else if (T_COMPARATOR::Operation(value, heap[0].value)) {
			std::pop_heap(heap, heap + size, Compare);
			heap[size - 1].Assign(allocator, value);
			std::push_heap(heap, heap + size, Compare);
		}
		D_ASSERT(std::is_heap(heap, heap + size, Compare));
	}